

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerReflection::emit_resources
          (CompilerReflection *this,char *tag,SmallVector<spirv_cross::Resource,_8UL> *resources)

{
  ID *__k;
  uint uVar1;
  uint __val;
  Stream *pSVar2;
  size_type sVar3;
  pointer pcVar4;
  bool bVar5;
  char cVar6;
  char cVar7;
  StorageClass SVar8;
  uint32_t uVar9;
  mapped_type *pmVar10;
  Bitset *pBVar11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  SPIRType *type;
  size_t sVar14;
  char *__s;
  size_t sVar15;
  uint uVar16;
  size_type *psVar17;
  _Alloc_hider _Var18;
  Resource *pRVar19;
  byte bVar20;
  Bitset buffer_flags;
  Bitset typeflags;
  undefined1 local_118 [64];
  string local_d8;
  SPIRType *local_b8;
  undefined1 local_b0 [8];
  undefined1 local_a8 [24];
  size_type local_90;
  _Prime_rehash_policy local_88;
  __node_base_ptr local_78;
  Resource *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  uint local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Resource *local_48;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_40;
  Bitset *local_38;
  
  if ((resources->super_VectorView<spirv_cross::Resource>).buffer_size != 0) {
    pSVar2 = (this->json_stream).super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    ::std::__cxx11::string::string((string *)local_b0,tag,(allocator *)local_118);
    simple_json::Stream::emit_json_key_array(pSVar2,(string *)local_b0);
    if (local_b0 != (undefined1  [8])(local_a8 + 8)) {
      operator_delete((void *)local_b0);
    }
    sVar14 = (resources->super_VectorView<spirv_cross::Resource>).buffer_size;
    if (sVar14 != 0) {
      pRVar19 = (resources->super_VectorView<spirv_cross::Resource>).ptr;
      local_48 = pRVar19 + sVar14;
      local_40 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&(this->super_CompilerGLSL).super_Compiler.ir.meta;
      do {
        local_b8 = Compiler::get_type((Compiler *)this,(TypeID)(pRVar19->type_id).id);
        __k = &(local_b8->super_IVariant).self;
        pmVar10 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[](local_40,__k);
        local_b0 = (undefined1  [8])(pmVar10->decoration).decoration_flags.lower;
        local_118._0_8_ = local_a8;
        local_a8._0_8_ = (__buckets_ptr)0x0;
        local_a8._8_8_ = (pmVar10->decoration).decoration_flags.higher._M_h._M_bucket_count;
        local_a8._16_8_ = 0;
        local_90 = (pmVar10->decoration).decoration_flags.higher._M_h._M_element_count;
        pBVar11 = &(pmVar10->decoration).decoration_flags;
        local_88._M_max_load_factor = (pBVar11->higher)._M_h._M_rehash_policy._M_max_load_factor;
        local_88._4_4_ = *(undefined4 *)&(pBVar11->higher)._M_h._M_rehash_policy.field_0x4;
        local_88._M_next_resize =
             (pmVar10->decoration).decoration_flags.higher._M_h._M_rehash_policy._M_next_resize;
        local_78 = (__node_base_ptr)0x0;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_118._0_8_,&(pmVar10->decoration).decoration_flags.higher._M_h,
                   (_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,_false>_>_> *)
                   local_118);
        local_38 = Compiler::get_decoration_bitset((Compiler *)this,(ID)(pRVar19->id).id);
        local_70 = pRVar19;
        SVar8 = Compiler::get_storage_class((Compiler *)this,(VariableID)(pRVar19->id).id);
        pBVar11 = Compiler::get_decoration_bitset((Compiler *)this,(ID)__k->id);
        bVar20 = 1;
        if ((pBVar11->lower & 4) == 0) {
          pBVar11 = Compiler::get_decoration_bitset((Compiler *)this,(ID)__k->id);
          bVar20 = ((byte)pBVar11->lower & 8) >> 3;
        }
        uVar1 = (&local_70->id)[(ulong)(SVar8 != StorageClassPushConstant & bVar20) * 2].id;
        simple_json::Stream::begin_json_object
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        pSVar2 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (*(int *)&(local_b8->super_IVariant).field_0xc == 0xf) {
          local_118._0_8_ = local_118 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"type","");
          __val = (local_70->base_type_id).id;
          cVar7 = '\x01';
          if (9 < __val) {
            uVar16 = __val;
            cVar6 = '\x04';
            do {
              cVar7 = cVar6;
              if (uVar16 < 100) {
                cVar7 = cVar7 + -2;
                goto LAB_0024343b;
              }
              if (uVar16 < 1000) {
                cVar7 = cVar7 + -1;
                goto LAB_0024343b;
              }
              if (uVar16 < 10000) goto LAB_0024343b;
              bVar5 = 99999 < uVar16;
              uVar16 = uVar16 / 10000;
              cVar6 = cVar7 + '\x04';
            } while (bVar5);
            cVar7 = cVar7 + '\x01';
          }
LAB_0024343b:
          local_68 = &local_58;
          ::std::__cxx11::string::_M_construct((ulong)&local_68,cVar7);
          ::std::__detail::__to_chars_10_impl<unsigned_int>(local_68->_M_local_buf,local_60,__val);
          plVar12 = (long *)::std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x2e7de5)
          ;
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          psVar17 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) {
            local_d8.field_2._M_allocated_capacity = *psVar17;
            local_d8.field_2._8_8_ = plVar12[3];
          }
          else {
            local_d8.field_2._M_allocated_capacity = *psVar17;
            local_d8._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_d8._M_string_length = plVar12[1];
          *plVar12 = (long)psVar17;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          simple_json::Stream::emit_json_key_value(pSVar2,(string *)local_118,&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          paVar13 = &local_58;
          _Var18._M_p = (pointer)local_68;
        }
        else {
          local_118._0_8_ = local_118 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"type","");
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                    (&local_d8,this,local_b8,0);
          simple_json::Stream::emit_json_key_value(pSVar2,(string *)local_118,&local_d8);
          paVar13 = &local_d8.field_2;
          _Var18._M_p = local_d8._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var18._M_p != paVar13) {
          operator_delete(_Var18._M_p);
        }
        if ((__hashtable_alloc *)local_118._0_8_ != (__hashtable_alloc *)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_);
        }
        pSVar2 = (this->json_stream).
                 super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_118._0_8_ = local_118 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"name","");
        sVar3 = (local_70->name)._M_string_length;
        if (sVar3 == 0) {
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[3])
                    (&local_d8,this,(ulong)uVar1);
        }
        else {
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          pcVar4 = (local_70->name)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>((string *)&local_d8,pcVar4,pcVar4 + sVar3);
        }
        simple_json::Stream::emit_json_key_value(pSVar2,(string *)local_118,&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        if ((__hashtable_alloc *)local_118._0_8_ != (__hashtable_alloc *)(local_118 + 0x10)) {
          operator_delete((void *)local_118._0_8_);
        }
        if ((local_b8->storage == StorageClassStorageBuffer) ||
           ((local_b8->storage == StorageClassUniform && (((ulong)local_b0 & 8) != 0)))) {
          Compiler::get_buffer_block_flags
                    ((Bitset *)local_118,(Compiler *)this,(VariableID)(local_70->id).id);
          if ((local_118._0_8_ & 0x2000000) != 0) {
            pSVar2 = (this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"writeonly","");
            simple_json::Stream::emit_json_key(pSVar2,&local_d8);
            StringStream<4096UL,_4096UL>::append(&pSVar2->buffer,"true",4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p);
            }
          }
          if ((local_118._0_8_ & 0x1000000) != 0) {
            pSVar2 = (this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"readonly","");
            simple_json::Stream::emit_json_key(pSVar2,&local_d8);
            StringStream<4096UL,_4096UL>::append(&pSVar2->buffer,"true",4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p);
            }
          }
          if ((local_118._0_8_ & 0x80000) != 0) {
            pSVar2 = (this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"restrict","");
            simple_json::Stream::emit_json_key(pSVar2,&local_d8);
            StringStream<4096UL,_4096UL>::append(&pSVar2->buffer,"true",4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p);
            }
          }
          if ((local_118._0_8_ & 0x800000) != 0) {
            pSVar2 = (this->json_stream).
                     super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"coherent","");
            simple_json::Stream::emit_json_key(pSVar2,&local_d8);
            StringStream<4096UL,_4096UL>::append(&pSVar2->buffer,"true",4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p);
            }
          }
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)(local_118 + 8));
        }
        emit_type_array(this,local_b8);
        pBVar11 = local_38;
        pRVar19 = local_70;
        if ((bVar20 != 0) &&
           (((SVar8 = Compiler::get_storage_class((Compiler *)this,(VariableID)(local_70->id).id),
             SVar8 == StorageClassUniform ||
             (SVar8 = Compiler::get_storage_class((Compiler *)this,(VariableID)(pRVar19->id).id),
             SVar8 == StorageClassUniformConstant)) ||
            (SVar8 = Compiler::get_storage_class((Compiler *)this,(VariableID)(pRVar19->id).id),
            SVar8 == StorageClassStorageBuffer)))) {
          type = Compiler::get_type((Compiler *)this,(TypeID)(pRVar19->base_type_id).id);
          sVar14 = Compiler::get_declared_struct_size((Compiler *)this,type);
          pSVar2 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_118._0_8_ = local_118 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"block_size","");
          simple_json::Stream::emit_json_key(pSVar2,(string *)local_118);
          StringStream<4096UL,_4096UL>::operator<<(&pSVar2->buffer,(uint32_t)sVar14);
          if ((__hashtable_alloc *)local_118._0_8_ != (__hashtable_alloc *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
        }
        if (local_b8->storage == StorageClassPushConstant) {
          pSVar2 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_118._0_8_ = local_118 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"push_constant","");
          simple_json::Stream::emit_json_key(pSVar2,(string *)local_118);
          StringStream<4096UL,_4096UL>::append(&pSVar2->buffer,"true",4);
          if ((__hashtable_alloc *)local_118._0_8_ != (__hashtable_alloc *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
        }
        if ((pBVar11->lower & 0x40000000) != 0) {
          pSVar2 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_118._0_8_ = local_118 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"location","");
          uVar9 = Compiler::get_decoration((Compiler *)this,(ID)(pRVar19->id).id,DecorationLocation)
          ;
          simple_json::Stream::emit_json_key(pSVar2,(string *)local_118);
          StringStream<4096UL,_4096UL>::operator<<(&pSVar2->buffer,uVar9);
          if ((__hashtable_alloc *)local_118._0_8_ != (__hashtable_alloc *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
        }
        if ((pBVar11->lower & 0x10) != 0) {
          pSVar2 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_118._0_8_ = local_118 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"row_major","");
          simple_json::Stream::emit_json_key(pSVar2,(string *)local_118);
          StringStream<4096UL,_4096UL>::append(&pSVar2->buffer,"true",4);
          if ((__hashtable_alloc *)local_118._0_8_ != (__hashtable_alloc *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
        }
        if ((pBVar11->lower & 0x20) != 0) {
          pSVar2 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_118._0_8_ = local_118 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"column_major","");
          simple_json::Stream::emit_json_key(pSVar2,(string *)local_118);
          StringStream<4096UL,_4096UL>::append(&pSVar2->buffer,"true",4);
          if ((__hashtable_alloc *)local_118._0_8_ != (__hashtable_alloc *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
        }
        if ((pBVar11->lower & 0x100000000) != 0) {
          pSVar2 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_118._0_8_ = local_118 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"index","");
          uVar9 = Compiler::get_decoration((Compiler *)this,(ID)(pRVar19->id).id,DecorationIndex);
          simple_json::Stream::emit_json_key(pSVar2,(string *)local_118);
          StringStream<4096UL,_4096UL>::operator<<(&pSVar2->buffer,uVar9);
          if ((__hashtable_alloc *)local_118._0_8_ != (__hashtable_alloc *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
        }
        if ((local_b8->storage != StorageClassPushConstant) && ((pBVar11->lower & 0x400000000) != 0)
           ) {
          pSVar2 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_118._0_8_ = local_118 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"set","");
          uVar9 = Compiler::get_decoration
                            ((Compiler *)this,(ID)(pRVar19->id).id,DecorationDescriptorSet);
          simple_json::Stream::emit_json_key(pSVar2,(string *)local_118);
          StringStream<4096UL,_4096UL>::operator<<(&pSVar2->buffer,uVar9);
          if ((__hashtable_alloc *)local_118._0_8_ != (__hashtable_alloc *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
        }
        if ((pBVar11->lower & 0x200000000) != 0) {
          pSVar2 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_118._0_8_ = local_118 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"binding","");
          uVar9 = Compiler::get_decoration((Compiler *)this,(ID)(pRVar19->id).id,DecorationBinding);
          simple_json::Stream::emit_json_key(pSVar2,(string *)local_118);
          StringStream<4096UL,_4096UL>::operator<<(&pSVar2->buffer,uVar9);
          if ((__hashtable_alloc *)local_118._0_8_ != (__hashtable_alloc *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
        }
        if ((pBVar11->lower & 0x80000000000) != 0) {
          pSVar2 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_118._0_8_ = local_118 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_118,"input_attachment_index","");
          uVar9 = Compiler::get_decoration
                            ((Compiler *)this,(ID)(pRVar19->id).id,DecorationInputAttachmentIndex);
          simple_json::Stream::emit_json_key(pSVar2,(string *)local_118);
          StringStream<4096UL,_4096UL>::operator<<(&pSVar2->buffer,uVar9);
          if ((__hashtable_alloc *)local_118._0_8_ != (__hashtable_alloc *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
        }
        if ((pBVar11->lower & 0x800000000) != 0) {
          pSVar2 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_118._0_8_ = local_118 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"offset","");
          uVar9 = Compiler::get_decoration((Compiler *)this,(ID)(pRVar19->id).id,DecorationOffset);
          simple_json::Stream::emit_json_key(pSVar2,(string *)local_118);
          StringStream<4096UL,_4096UL>::operator<<(&pSVar2->buffer,uVar9);
          if ((__hashtable_alloc *)local_118._0_8_ != (__hashtable_alloc *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
        }
        if (((*(int *)&(local_b8->super_IVariant).field_0xc == 0x10) &&
            ((local_b8->image).sampled == 2)) &&
           (__s = CompilerGLSL::format_to_glsl(&this->super_CompilerGLSL,(local_b8->image).format),
           __s != (char *)0x0)) {
          pSVar2 = (this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_118._0_8_ = local_118 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"format","");
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          sVar15 = strlen(__s);
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,__s,__s + sVar15);
          simple_json::Stream::emit_json_key_value(pSVar2,(string *)local_118,&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          if ((__hashtable_alloc *)local_118._0_8_ != (__hashtable_alloc *)(local_118 + 0x10)) {
            operator_delete((void *)local_118._0_8_);
          }
        }
        simple_json::Stream::end_json_object
                  ((this->json_stream).
                   super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_a8);
        pRVar19 = local_70 + 1;
      } while (pRVar19 != local_48);
    }
    simple_json::Stream::end_json_array
              ((this->json_stream).
               super___shared_ptr<simple_json::Stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void statement_no_return(Ts &&... ts)
	{
		statement_indent();
		statement_inner(std::forward<Ts>(ts)...);
	}